

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * ghc::filesystem::relative(path *p,path *base)

{
  path *in_RDI;
  path *in_stack_000005b0;
  path *in_stack_000005b8;
  path *p_00;
  
  p_00 = in_RDI;
  weakly_canonical(in_RDI);
  weakly_canonical(p_00);
  path::lexically_relative(in_stack_000005b8,in_stack_000005b0);
  path::~path((path *)0x1dbbfe);
  path::~path((path *)0x1dbc08);
  return in_RDI;
}

Assistant:

GHC_INLINE path relative(const path& p, const path& base)
{
    return weakly_canonical(p).lexically_relative(weakly_canonical(base));
}